

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9EquivMark(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fVerbose;
  uint fSkipSome;
  char *pcVar3;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fSkipSome = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"fvh"), iVar1 == 0x66) {
      fSkipSome = fSkipSome ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x76) goto LAB_002810d8;
    fVerbose = fVerbose ^ 1;
  }
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    pcVar2 = "Abc_CommandAbc9EquivMark(): There is no AIG.\n";
    iVar1 = -1;
    goto LAB_00281209;
  }
  if (globalUtilOptind + 1 == argc) {
    Gia_ManEquivMark(pAbc->pGia,argv[globalUtilOptind],fSkipSome,fVerbose);
    return 0;
  }
LAB_002810d8:
  Abc_Print(-2,"usage: &equiv_mark [-fvh] <miter.aig>\n");
  Abc_Print(-2,"\t              marks equivalences using an external miter\n");
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (fSkipSome == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-f          : toggle the use of filtered equivalences [default = %s]\n",pcVar2);
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v          : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h          : print the command usage\n");
  Abc_Print(-2,"\t<miter.aig> : file with the external miter to read\n");
  Abc_Print(-2,"\t              \n");
  Abc_Print(-2,"\t              The external miter should be generated by &srm -s\n");
  Abc_Print(-2,"\t              and (partially) solved by any verification engine(s).\n");
  Abc_Print(-2,"\t              The external miter should have as many POs as\n");
  Abc_Print(-2,"\t              the number of POs in the current AIG plus\n");
  Abc_Print(-2,"\t              the number of equivalences in the current AIG.\n");
  Abc_Print(-2,"\t              If some POs are proved, the corresponding equivs\n");
  pcVar2 = "\t              are marked as proved, to be reduced by &reduce.\n";
  iVar1 = -2;
LAB_00281209:
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9EquivMark( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManEquivMark( Gia_Man_t * p, char * pFileName, int fSkipSome, int fVerbose );
    char * pFileName;
    int c, fVerbose = 0;
    int fSkipSome = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fSkipSome ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9EquivMark(): There is no AIG.\n" );
        return 1;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // mark equivalences
    Gia_ManEquivMark( pAbc->pGia, pFileName, fSkipSome, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv_mark [-fvh] <miter.aig>\n" );
    Abc_Print( -2, "\t              marks equivalences using an external miter\n" );
    Abc_Print( -2, "\t-f          : toggle the use of filtered equivalences [default = %s]\n", fSkipSome? "yes": "no" );
    Abc_Print( -2, "\t-v          : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h          : print the command usage\n");
    Abc_Print( -2, "\t<miter.aig> : file with the external miter to read\n");
    Abc_Print( -2, "\t              \n" );
    Abc_Print( -2, "\t              The external miter should be generated by &srm -s\n" );
    Abc_Print( -2, "\t              and (partially) solved by any verification engine(s).\n" );
    Abc_Print( -2, "\t              The external miter should have as many POs as\n" );
    Abc_Print( -2, "\t              the number of POs in the current AIG plus\n" );
    Abc_Print( -2, "\t              the number of equivalences in the current AIG.\n" );
    Abc_Print( -2, "\t              If some POs are proved, the corresponding equivs\n" );
    Abc_Print( -2, "\t              are marked as proved, to be reduced by &reduce.\n" );
    return 1;
}